

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void basic_suite::fail_nuller(void)

{
  char input [7];
  decoder_type decoder;
  undefined4 local_160;
  value local_15c;
  value_type local_158 [8];
  basic_decoder<char> local_150;
  
  builtin_memcpy(local_158,"nuller",7);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<7ul>
            (&local_150,(value_type (*) [7])local_158);
  local_15c = local_150.current.code;
  local_160 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x102,"void basic_suite::fail_nuller()",&local_15c,&local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[7]>
            ("decoder.literal()","\"nuller\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x103,"void basic_suite::fail_nuller()",&local_150.current.view,"nuller");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x104,"void basic_suite::fail_nuller()",&local_150,"");
  return;
}

Assistant:

void fail_nuller()
{
    const char input[] = "nuller";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "nuller");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "");
}